

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  int iVar1;
  undefined4 extraout_var;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (&this->super_BayesianGameForDecPOMDPStageInterface,0);
  iVar1 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)((long)*(pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x58))();
  PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector
            (&local_38,&pu->super_PlanningUnitMADPDiscrete,0);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff,CONCAT44(extraout_var,iVar1),nrActions,
             &local_38,false);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a1590;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a15e0;
  this->_m_pu = pu;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_qHeuristic = (QFunctionJAOHInterface *)SUB328(ZEXT432(0) << 0x40,0);
  this->_m_JBs = (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
                 SUB3224(ZEXT432(0) << 0x40,8);
  this->_m_areCachedImmediateRewards = false;
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(
        const PlanningUnitDecPOMDPDiscrete* pu
    )
        :
    BayesianGameForDecPOMDPStageInterface(static_cast<Index>(0)),
            BayesianGameIdenticalPayoff( 
                pu->GetNrAgents(), 
                pu->GetNrActions(), 
                pu->GetNrObservationHistoriesVector(0)
            )           
            ,_m_pu(pu)
            ,_m_qHeuristic(0)
            ,_m_JBs( 0 )
            ,_m_areCachedImmediateRewards(false)
{
}